

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseEmitter::commentv(BaseEmitter *this,char *fmt,__va_list_tag *ap)

{
  bool bVar1;
  Error EVar2;
  __va_list_tag *in_RDX;
  char *in_RSI;
  long *in_RDI;
  Error _err;
  Error err;
  StringTmp<1024UL> sb;
  undefined4 in_stack_fffffffffffffaf8;
  Error in_stack_fffffffffffffafc;
  char *in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  BaseEmitter *in_stack_fffffffffffffb10;
  StringTmp<1024UL> local_4a8;
  undefined1 auStack_4a7 [7];
  ulong local_4a0;
  undefined1 *local_490;
  long *plVar3;
  ModifyOp op;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  
  EVar2 = (Error)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  plVar3 = in_RDI;
  bVar1 = Support::test<asmjit::v1_14::EmitterFlags,asmjit::v1_14::EmitterFlags>
                    (*(EmitterFlags *)((long)in_RDI + 9),kLogComments);
  op = (ModifyOp)((ulong)plVar3 >> 0x20);
  if (bVar1) {
    memset(&local_4a8,0,0x20);
    StringTmp<1024UL>::_resetToTemporary(&local_4a8);
    EVar2 = String::_opVFormat((String *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),op,
                               in_RSI,in_RDX);
    if (EVar2 == 0) {
      if ((byte)local_4a8 < 0x1f) {
        local_490 = auStack_4a7;
        local_4a0 = (ulong)(byte)local_4a8;
      }
      in_stack_fffffffffffffafc = (**(code **)(*in_RDI + 0x78))(in_RDI,local_490,local_4a0);
      EVar2 = in_stack_fffffffffffffafc;
    }
    StringTmp<1024UL>::~StringTmp
              ((StringTmp<1024UL> *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  }
  else {
    bVar1 = Support::test<asmjit::v1_14::EmitterFlags,asmjit::v1_14::EmitterFlags>
                      (*(EmitterFlags *)((long)in_RDI + 9),kAttached);
    if (bVar1) {
      EVar2 = 0;
    }
    else {
      DebugUtils::errored(5);
      EVar2 = reportError(in_stack_fffffffffffffb10,EVar2,in_stack_fffffffffffffb00);
    }
  }
  return EVar2;
}

Assistant:

Error BaseEmitter::commentv(const char* fmt, va_list ap) {
  if (!hasEmitterFlag(EmitterFlags::kLogComments)) {
    if (!hasEmitterFlag(EmitterFlags::kAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  StringTmp<1024> sb;
  Error err = sb.appendVFormat(fmt, ap);

  ASMJIT_PROPAGATE(err);
  return comment(sb.data(), sb.size());
#else
  DebugUtils::unused(fmt, ap);
  return kErrorOk;
#endif
}